

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O1

void __thiscall
robin_hood::detail::
Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::NamedDecorator,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::shiftUp(Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::NamedDecorator,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *this,size_t startIdx,size_t insertion_idx)

{
  Node *pNVar1;
  Node *pNVar2;
  pointer pcVar3;
  DecoratorInstancer *pDVar4;
  Node *pNVar5;
  undefined8 uVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  long lVar9;
  long lVar10;
  
  pNVar2 = this->mKeyVals;
  lVar10 = startIdx * 0x78;
  pNVar5 = pNVar2 + startIdx;
  pNVar1 = pNVar2 + startIdx;
  paVar8 = &(pNVar1->mData).first.field_2;
  (pNVar1->mData).first._M_dataplus._M_p = (pointer)paVar8;
  pcVar3 = pNVar1[-1].mData.first._M_dataplus._M_p;
  paVar7 = &pNVar2[startIdx - 1].mData.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar7) {
    uVar6 = *(undefined8 *)((long)&pNVar2[startIdx - 1].mData.first.field_2 + 8);
    paVar8->_M_allocated_capacity = paVar7->_M_allocated_capacity;
    *(undefined8 *)((long)&(pNVar1->mData).first.field_2 + 8) = uVar6;
  }
  else {
    (pNVar5->mData).first._M_dataplus._M_p = pcVar3;
    (pNVar5->mData).first.field_2._M_allocated_capacity =
         pNVar5[-1].mData.first.field_2._M_allocated_capacity;
  }
  pcVar3 = pNVar5[-1].mData.second.type._M_dataplus._M_p;
  (pNVar5->mData).first._M_string_length = pNVar5[-1].mData.first._M_string_length;
  pNVar5[-1].mData.first._M_dataplus._M_p = (pointer)paVar7;
  pNVar5[-1].mData.first._M_string_length = 0;
  pNVar5[-1].mData.first.field_2._M_local_buf[0] = '\0';
  paVar7 = &(pNVar5->mData).second.type.field_2;
  (pNVar5->mData).second.type._M_dataplus._M_p = (pointer)paVar7;
  paVar8 = &pNVar5[-1].mData.second.type.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar8) {
    uVar6 = *(undefined8 *)((long)&pNVar5[-1].mData.second.type.field_2 + 8);
    paVar7->_M_allocated_capacity = paVar8->_M_allocated_capacity;
    *(undefined8 *)((long)&(pNVar5->mData).second.type.field_2 + 8) = uVar6;
  }
  else {
    (pNVar5->mData).second.type._M_dataplus._M_p = pcVar3;
    (pNVar5->mData).second.type.field_2._M_allocated_capacity =
         pNVar5[-1].mData.second.type.field_2._M_allocated_capacity;
  }
  pDVar4 = pNVar5[-1].mData.second.instancer;
  (pNVar5->mData).second.type._M_string_length = pNVar5[-1].mData.second.type._M_string_length;
  pNVar5[-1].mData.second.type._M_dataplus._M_p = (pointer)paVar8;
  pNVar5[-1].mData.second.type._M_string_length = 0;
  pNVar5[-1].mData.second.type.field_2._M_local_buf[0] = '\0';
  (pNVar5->mData).second.instancer = pDVar4;
  Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
  ::Table(&(pNVar5->mData).second.properties.properties,
          &pNVar5[-1].mData.second.properties.properties);
  if (startIdx - 1 != insertion_idx) {
    lVar9 = (insertion_idx - startIdx) + 1;
    do {
      pNVar5 = this->mKeyVals;
      std::__cxx11::string::operator=
                ((string *)((long)&pNVar5[-1].mData.first._M_dataplus._M_p + lVar10),
                 (string *)((long)&pNVar5[-2].mData.first._M_dataplus._M_p + lVar10));
      std::__cxx11::string::operator=
                ((string *)((long)pNVar5 + lVar10 + -0x58),(string *)((long)pNVar5 + lVar10 + -0xd0)
                );
      *(undefined8 *)((long)pNVar5 + lVar10 + -0x38) =
           *(undefined8 *)((long)pNVar5 + lVar10 + -0xb0);
      Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
      ::operator=((Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
                   *)((long)pNVar5 + lVar10 + -0x30),
                  (Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
                   *)((long)pNVar5 + lVar10 + -0xa8));
      lVar10 = lVar10 + -0x78;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 0);
  }
  if (startIdx != insertion_idx) {
    do {
      this->mInfo[startIdx] = this->mInfo[startIdx - 1] + (char)this->mInfoInc;
      if (0xff < (uint)this->mInfo[startIdx] + this->mInfoInc) {
        this->mMaxNumElementsAllowed = 0;
      }
      startIdx = startIdx - 1;
    } while (insertion_idx != startIdx);
  }
  return;
}

Assistant:

void
    shiftUp(size_t startIdx,
            size_t const insertion_idx) noexcept(std::is_nothrow_move_assignable<Node>::value) {
        auto idx = startIdx;
        ::new (static_cast<void*>(mKeyVals + idx)) Node(std::move(mKeyVals[idx - 1]));
        while (--idx != insertion_idx) {
            mKeyVals[idx] = std::move(mKeyVals[idx - 1]);
        }

        idx = startIdx;
        while (idx != insertion_idx) {
            ROBIN_HOOD_COUNT(shiftUp)
            mInfo[idx] = static_cast<uint8_t>(mInfo[idx - 1] + mInfoInc);
            if (ROBIN_HOOD_UNLIKELY(mInfo[idx] + mInfoInc > 0xFF)) {
                mMaxNumElementsAllowed = 0;
            }
            --idx;
        }
    }